

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_convertAlgorithmic
                  (UBool convertToAlgorithmic,UConverterType algorithmicType,UConverter *cnv,
                  char *target,int32_t targetCapacity,char *source,int32_t sourceLength,
                  UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UConverter *converter;
  UConverter *pUStack_170;
  int32_t targetLength;
  UConverter *from;
  UConverter *to;
  UConverter *algoConverter;
  UConverter algoConverterStatic;
  char *source_local;
  int32_t targetCapacity_local;
  char *target_local;
  UConverter *cnv_local;
  UConverterType algorithmicType_local;
  UBool convertToAlgorithmic_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (algoConverterStatic._280_8_ = source, UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if ((cnv != (UConverter *)0x0) &&
     ((((algoConverterStatic._280_8_ != 0 && (-2 < sourceLength)) && (-1 < targetCapacity)) &&
      ((targetCapacity < 1 || (target != (char *)0x0)))))) {
    if ((sourceLength != 0) &&
       ((-1 < sourceLength || (*(char *)algoConverterStatic._280_8_ != '\0')))) {
      converter = ucnv_createAlgorithmicConverter_63
                            ((UConverter *)&algoConverter,algorithmicType,"",0,pErrorCode);
      UVar1 = U_FAILURE(*pErrorCode);
      if (UVar1 != '\0') {
        return 0;
      }
      if (convertToAlgorithmic == '\0') {
        ucnv_resetFromUnicode_63(cnv);
        pUStack_170 = converter;
        from = cnv;
      }
      else {
        ucnv_resetToUnicode_63(cnv);
        pUStack_170 = cnv;
        from = converter;
      }
      iVar2 = ucnv_internalConvert
                        (from,pUStack_170,target,targetCapacity,(char *)algoConverterStatic._280_8_,
                         sourceLength,pErrorCode);
      ucnv_close_63(converter);
      return iVar2;
    }
    iVar2 = u_terminateChars_63(target,targetCapacity,0,pErrorCode);
    return iVar2;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

static int32_t
ucnv_convertAlgorithmic(UBool convertToAlgorithmic,
                        UConverterType algorithmicType,
                        UConverter *cnv,
                        char *target, int32_t targetCapacity,
                        const char *source, int32_t sourceLength,
                        UErrorCode *pErrorCode) {
    UConverter algoConverterStatic; /* stack-allocated */
    UConverter *algoConverter, *to, *from;
    int32_t targetLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL || source==NULL || sourceLength<-1 ||
        targetCapacity<0 || (targetCapacity>0 && target==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* if there is no input data, we're done */
    if(sourceLength==0 || (sourceLength<0 && *source==0)) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    /* create the algorithmic converter */
    algoConverter=ucnv_createAlgorithmicConverter(&algoConverterStatic, algorithmicType,
                                                  "", 0, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* reset the other converter */
    if(convertToAlgorithmic) {
        /* cnv->Unicode->algo */
        ucnv_resetToUnicode(cnv);
        to=algoConverter;
        from=cnv;
    } else {
        /* algo->Unicode->cnv */
        ucnv_resetFromUnicode(cnv);
        from=algoConverter;
        to=cnv;
    }

    targetLength=ucnv_internalConvert(to, from,
                                      target, targetCapacity,
                                      source, sourceLength,
                                      pErrorCode);

    ucnv_close(algoConverter);

    return targetLength;
}